

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O2

string * __thiscall
optimization::global_expr_move::Global_Expr_Mov::pass_name_abi_cxx11_
          (string *__return_storage_ptr__,Global_Expr_Mov *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

std::string pass_name() const { return name; }